

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_exec(sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  byte *pbVar1;
  bool bVar2;
  Vdbe *pVVar3;
  int iVar4;
  int rc;
  uchar *puVar5;
  Mem *pMVar6;
  char **p;
  char *pcVar7;
  char *pcVar8;
  uint uVar10;
  char **ppcVar9;
  Vdbe *pVm;
  ulong uVar12;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  Vdbe *local_78;
  sqlite3 *local_70;
  int local_64;
  char **local_60;
  char *local_58;
  uint local_4c;
  sqlite3_callback local_48;
  char **local_40;
  void *local_38;
  ulong uVar11;
  
  local_78 = (Vdbe *)0x0;
  local_48 = xCallback;
  local_38 = pArg;
  iVar4 = sqlite3SafetyCheckOk(db);
  if (iVar4 == 0) {
    iVar4 = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x1f995,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
  }
  else {
    pcVar8 = "";
    if (zSql != (char *)0x0) {
      pcVar8 = zSql;
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    }
    db->errCode = 0;
    local_40 = pzErrMsg;
    if (db->pErr == (sqlite3_value *)0x0) {
      db->errByteOffset = -1;
    }
    else {
      sqlite3ErrorFinish(db,0);
    }
    p = (char **)0x0;
    local_70 = db;
    do {
      if (*pcVar8 == '\0') {
        rc = 0;
        break;
      }
      local_78 = (Vdbe *)0x0;
      rc = sqlite3LockAndPrepare(db,pcVar8,-1,0x80,(Vdbe *)0x0,(sqlite3_stmt **)&local_78,&local_58)
      ;
      iVar4 = 2;
      if (rc == 0) {
        if (local_78 == (Vdbe *)0x0) {
          rc = 0;
          pcVar8 = local_58;
        }
        else {
          bVar2 = false;
          uVar11 = 0;
          local_60 = (char **)0x0;
          do {
            pVVar3 = local_78;
            rc = sqlite3_step((sqlite3_stmt *)local_78);
            if (local_48 == (sqlite3_callback)0x0) {
LAB_0011f1da:
              if (rc == 100) {
                iVar4 = 0;
                rc = 100;
              }
              else {
                rc = sqlite3VdbeFinalize(local_78);
                local_78 = (Vdbe *)0x0;
                pcVar8 = local_58 + -1;
                do {
                  pbVar1 = (byte *)(pcVar8 + 1);
                  pcVar8 = pcVar8 + 1;
                } while ((""[*pbVar1] & 1) != 0);
                iVar4 = 5;
              }
            }
            else {
              if (rc != 100) {
                if (rc == 0x65 && !bVar2) {
                  if ((local_70->flags & 0x100) != 0) goto LAB_0011f0a5;
                  bVar2 = false;
                }
                goto LAB_0011f1da;
              }
LAB_0011f0a5:
              local_64 = rc;
              if (bVar2) {
LAB_0011f0b4:
                uVar10 = (uint)uVar11;
                ppcVar9 = local_60;
                if (rc == 100) {
                  ppcVar9 = p + uVar11;
                  uVar12 = 0;
                  local_60 = ppcVar9;
                  local_4c = uVar10;
                  if (0 < (int)uVar10) {
                    do {
                      puVar5 = sqlite3_column_text((sqlite3_stmt *)local_78,(int)uVar12);
                      pVVar3 = local_78;
                      ppcVar9[uVar12] = (char *)puVar5;
                      if (puVar5 == (uchar *)0x0) {
                        pMVar6 = columnMem((sqlite3_stmt *)local_78,(int)uVar12);
                        ppcVar9 = local_60;
                        uVar10._0_2_ = pMVar6->flags;
                        uVar10._2_1_ = pMVar6->enc;
                        uVar10._3_1_ = pMVar6->eSubtype;
                        columnMallocFailure((sqlite3_stmt *)pVVar3);
                        if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
                          sqlite3OomFault(local_70);
                          iVar4 = 6;
                          bVar2 = true;
                          rc = 100;
                          goto LAB_0011f217;
                        }
                      }
                      uVar12 = uVar12 + 1;
                    } while (uVar11 != uVar12);
                  }
                  ppcVar9[uVar12] = (char *)0x0;
                  uVar10 = local_4c;
                }
                local_60 = ppcVar9;
                iVar4 = (*local_48)(local_38,uVar10,ppcVar9,p);
                if (iVar4 == 0) {
                  uVar11 = (ulong)uVar10;
                  bVar2 = true;
                  rc = local_64;
                  goto LAB_0011f1da;
                }
                sqlite3VdbeFinalize(local_78);
                local_78 = (Vdbe *)0x0;
                local_70->errCode = 4;
                sqlite3ErrorFinish(local_70,4);
                rc = 4;
                iVar4 = 6;
                bVar2 = true;
              }
              else {
                if (pVVar3 == (Vdbe *)0x0) {
                  uVar10 = 0;
                }
                else {
                  uVar10 = (uint)pVVar3->nResColumn;
                }
                uVar11 = (ulong)uVar10;
                uVar12 = (ulong)(uVar10 << 4 | 8);
                if (local_70 == (sqlite3 *)0x0) {
                  p = (char **)sqlite3Malloc(uVar12);
                }
                else {
                  p = (char **)sqlite3DbMallocRawNN(local_70,uVar12);
                }
                if (p != (char **)0x0) {
                  uVar11 = (ulong)uVar10;
                  if (uVar10 != 0) {
                    uVar12 = 0;
                    do {
                      pcVar7 = (char *)columnName((sqlite3_stmt *)pVVar3,(int)uVar12,0,0);
                      p[uVar12] = pcVar7;
                      uVar12 = uVar12 + 1;
                      rc = local_64;
                    } while (uVar11 != uVar12);
                  }
                  goto LAB_0011f0b4;
                }
                iVar4 = 6;
                p = (char **)0x0;
                bVar2 = false;
              }
            }
LAB_0011f217:
            db = local_70;
          } while (iVar4 == 0);
          if (iVar4 == 5) {
            if (p != (char **)0x0) {
              sqlite3DbFreeNN(local_70,p);
            }
            p = (char **)0x0;
            iVar4 = 0;
          }
        }
      }
      if ((iVar4 != 0) && (iVar4 != 2)) {
        if (iVar4 != 6) {
          return (int)&local_58;
        }
        break;
      }
    } while (rc == 0);
    if (local_78 != (Vdbe *)0x0) {
      sqlite3VdbeFinalize(local_78);
    }
    ppcVar9 = local_40;
    if (p != (char **)0x0) {
      sqlite3DbFreeNN(db,p);
    }
    if ((rc != 0) || (iVar4 = 0, db->mallocFailed != '\0')) {
      iVar4 = apiHandleError(db,rc);
    }
    if ((ppcVar9 == (char **)0x0) || (iVar4 == 0)) {
      if (ppcVar9 != (char **)0x0) {
        *ppcVar9 = (char *)0x0;
      }
    }
    else {
      pcVar8 = sqlite3_errmsg(db);
      pcVar8 = sqlite3DbStrDup((sqlite3 *)0x0,pcVar8);
      *ppcVar9 = pcVar8;
      if (pcVar8 == (char *)0x0) {
        db->errCode = 7;
        iVar4 = 7;
        sqlite3ErrorFinish(db,7);
      }
    }
    if (db->mutex != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
    }
  }
  return iVar4;
}

Assistant:

SQLITE_API int sqlite3_exec(
  sqlite3 *db,                /* The database on which the SQL executes */
  const char *zSql,           /* The SQL to be executed */
  sqlite3_callback xCallback, /* Invoke this callback routine */
  void *pArg,                 /* First argument to xCallback() */
  char **pzErrMsg             /* Write error messages here */
){
  int rc = SQLITE_OK;         /* Return code */
  const char *zLeftover;      /* Tail of unprocessed SQL */
  sqlite3_stmt *pStmt = 0;    /* The current SQL statement */
  char **azCols = 0;          /* Names of result columns */
  int callbackIsInit;         /* True if callback data is initialized */

  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
  if( zSql==0 ) zSql = "";

  sqlite3_mutex_enter(db->mutex);
  sqlite3Error(db, SQLITE_OK);
  while( rc==SQLITE_OK && zSql[0] ){
    int nCol = 0;
    char **azVals = 0;

    pStmt = 0;
    rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
    assert( rc==SQLITE_OK || pStmt==0 );
    if( rc!=SQLITE_OK ){
      continue;
    }
    if( !pStmt ){
      /* this happens for a comment or white-space */
      zSql = zLeftover;
      continue;
    }
    callbackIsInit = 0;

    while( 1 ){
      int i;
      rc = sqlite3_step(pStmt);

      /* Invoke the callback function if required */
      if( xCallback && (SQLITE_ROW==rc ||
          (SQLITE_DONE==rc && !callbackIsInit
                           && db->flags&SQLITE_NullCallback)) ){
        if( !callbackIsInit ){
          nCol = sqlite3_column_count(pStmt);
          azCols = sqlite3DbMallocRaw(db, (2*nCol+1)*sizeof(const char*));
          if( azCols==0 ){
            goto exec_out;
          }
          for(i=0; i<nCol; i++){
            azCols[i] = (char *)sqlite3_column_name(pStmt, i);
            /* sqlite3VdbeSetColName() installs column names as UTF8
            ** strings so there is no way for sqlite3_column_name() to fail. */
            assert( azCols[i]!=0 );
          }
          callbackIsInit = 1;
        }
        if( rc==SQLITE_ROW ){
          azVals = &azCols[nCol];
          for(i=0; i<nCol; i++){
            azVals[i] = (char *)sqlite3_column_text(pStmt, i);
            if( !azVals[i] && sqlite3_column_type(pStmt, i)!=SQLITE_NULL ){
              sqlite3OomFault(db);
              goto exec_out;
            }
          }
          azVals[i] = 0;
        }
        if( xCallback(pArg, nCol, azVals, azCols) ){
          /* EVIDENCE-OF: R-38229-40159 If the callback function to
          ** sqlite3_exec() returns non-zero, then sqlite3_exec() will
          ** return SQLITE_ABORT. */
          rc = SQLITE_ABORT;
          sqlite3VdbeFinalize((Vdbe *)pStmt);
          pStmt = 0;
          sqlite3Error(db, SQLITE_ABORT);
          goto exec_out;
        }
      }

      if( rc!=SQLITE_ROW ){
        rc = sqlite3VdbeFinalize((Vdbe *)pStmt);
        pStmt = 0;
        zSql = zLeftover;
        while( sqlite3Isspace(zSql[0]) ) zSql++;
        break;
      }
    }

    sqlite3DbFree(db, azCols);
    azCols = 0;
  }

exec_out:
  if( pStmt ) sqlite3VdbeFinalize((Vdbe *)pStmt);
  sqlite3DbFree(db, azCols);

  rc = sqlite3ApiExit(db, rc);
  if( rc!=SQLITE_OK && pzErrMsg ){
    *pzErrMsg = sqlite3DbStrDup(0, sqlite3_errmsg(db));
    if( *pzErrMsg==0 ){
      rc = SQLITE_NOMEM_BKPT;
      sqlite3Error(db, SQLITE_NOMEM);
    }
  }else if( pzErrMsg ){
    *pzErrMsg = 0;
  }

  assert( (rc&db->errMask)==rc );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}